

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameclient.cpp
# Opt level: O2

void __thiscall CGameClient::OnMessage(CGameClient *this,int MsgId,CUnpacker *pUnpacker)

{
  CNetObjHandler *this_00;
  int *piVar1;
  undefined8 uVar2;
  uint uVar3;
  long lVar4;
  IClient *pIVar5;
  CComponent *pCVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int *piVar12;
  char *pcVar13;
  _func_int *UNRECOVERED_JUMPTABLE;
  long lVar14;
  char *pcVar15;
  CTuningParams *pCVar16;
  IConsole *pIVar17;
  CSounds *this_01;
  CChat *pCVar18;
  CBroadcast *this_02;
  int i_2;
  long lVar19;
  char (*pacVar20) [97];
  int i;
  char (*pacVar21) [97];
  CNetMsg_Sv_Emoticon *pMsg;
  ulong uVar22;
  uint i_1;
  long in_FS_OFFSET;
  byte bVar23;
  float fVar24;
  long lStack_1a0;
  char aLabel [64];
  char aBuf [256];
  int aParaI [3];
  
  bVar23 = 0;
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  (*(this->m_pClient->super_IInterface)._vptr_IInterface[9])(this->m_pClient,1);
  if (MsgId != 0x15) {
    if (MsgId == 0xc) {
      iVar9 = CUnpacker::GetInt(pUnpacker);
      iVar11 = 0;
      if (0 < iVar9) {
        iVar11 = iVar9;
      }
      while (iVar11 != 0) {
        pcVar15 = CUnpacker::GetString(pUnpacker,2);
        if (pUnpacker->m_Error != 0) goto switchD_00175f97_caseD_5;
        CVoting::AddOption(this->m_pVoting,pcVar15);
        iVar11 = iVar11 + -1;
      }
    }
    else if ((MsgId == 6) && (pIVar5 = this->m_pClient, pIVar5->m_State != 4)) {
      (*(pIVar5->super_IInterface)._vptr_IInterface[9])(pIVar5,0);
      aBuf[0] = -0x18;
      aBuf[1] = '\x03';
      aBuf[2] = '\0';
      aBuf[3] = '\0';
      aBuf[4] = -0x38;
      aBuf[5] = '\0';
      aBuf[6] = '\0';
      aBuf[7] = '\0';
      aBuf[8] = '2';
      aBuf[9] = '\0';
      aBuf[10] = '\0';
      aBuf[0xb] = '\0';
      aBuf[0xc] = '(';
      aBuf[0xd] = '\x05';
      aBuf[0xe] = '\0';
      aBuf[0xf] = '\0';
      aBuf[0x10] = -0x50;
      aBuf[0x11] = '\x04';
      aBuf[0x12] = '\0';
      aBuf[0x13] = '\0';
      aBuf[0x14] = -0xc;
      aBuf[0x15] = '\x01';
      aBuf[0x16] = '\0';
      aBuf[0x17] = '\0';
      aBuf[0x18] = -0x6a;
      aBuf[0x19] = '\0';
      aBuf[0x1a] = '\0';
      aBuf[0x1b] = '\0';
      aBuf[0x1c] = '_';
      aBuf[0x1d] = '\0';
      aBuf[0x1e] = '\0';
      aBuf[0x1f] = '\0';
      aBuf[0x20] = 'p';
      aBuf[0x21] = -0x6c;
      aBuf[0x22] = '\0';
      aBuf[0x23] = '\0';
      aBuf[0x24] = '@';
      aBuf[0x25] = '\x1f';
      aBuf[0x26] = '\0';
      aBuf[0x27] = '\0';
      aBuf[0x28] = ',';
      aBuf[0x29] = '\x01';
      aBuf[0x2a] = '\0';
      aBuf[0x2b] = '\0';
      aBuf[0x2c] = -0x24;
      aBuf[0x2d] = '\x05';
      aBuf[0x2e] = '\0';
      aBuf[0x2f] = '\0';
      aBuf[0x30] = '2';
      aBuf[0x31] = '\0';
      aBuf[0x32] = '\0';
      aBuf[0x33] = '\0';
      aBuf[0x34] = -0x28;
      aBuf[0x35] = -0x2a;
      aBuf[0x36] = '\0';
      aBuf[0x37] = '\0';
      aBuf[0x38] = '@';
      aBuf[0x39] = '\r';
      aBuf[0x3a] = '\x03';
      aBuf[0x3b] = '\0';
      aBuf[0x3c] = -0x74;
      aBuf[0x3d] = '\0';
      aBuf[0x3e] = '\0';
      aBuf[0x3f] = '\0';
      aBuf[0x40] = '}';
      aBuf[0x41] = '\0';
      aBuf[0x42] = '\0';
      aBuf[0x43] = '\0';
      aBuf[0x44] = '`';
      aBuf[0x45] = '[';
      aBuf[0x46] = '\x03';
      aBuf[0x47] = '\0';
      aBuf[0x48] = -0x38;
      aBuf[0x49] = '\0';
      aBuf[0x4a] = '\0';
      aBuf[0x4b] = '\0';
      aBuf[0x4c] = '}';
      aBuf[0x4d] = '\0';
      aBuf[0x4e] = '\0';
      aBuf[0x4f] = '\0';
      aBuf[0x50] = '8';
      aBuf[0x51] = '2';
      aBuf[0x52] = '\x04';
      aBuf[0x53] = '\0';
      aBuf[0x54] = 'P';
      aBuf[0x55] = '\0';
      aBuf[0x56] = '\0';
      aBuf[0x57] = '\0';
      aBuf[0x58] = '\x14';
      aBuf[0x59] = '\0';
      aBuf[0x5a] = '\0';
      aBuf[0x5b] = '\0';
      aBuf[0x5c] = -0x44;
      aBuf[0x5d] = '\x02';
      aBuf[0x5e] = '\0';
      aBuf[0x5f] = '\0';
      aBuf[0x60] = -0x60;
      aBuf[0x61] = -0x7a;
      aBuf[0x62] = '\x01';
      aBuf[99] = '\0';
      aBuf[100] = -0x38;
      aBuf[0x65] = '\0';
      aBuf[0x66] = '\0';
      aBuf[0x67] = '\0';
      aBuf[0x68] = -0x80;
      aBuf[0x69] = '8';
      aBuf[0x6a] = '\x01';
      aBuf[0x6b] = '\0';
      aBuf[0x6c] = -0x68;
      aBuf[0x6d] = ':';
      aBuf[0x6e] = '\0';
      aBuf[0x6f] = '\0';
      aBuf[0x70] = 'd';
      aBuf[0x71] = '\0';
      aBuf[0x72] = '\0';
      aBuf[0x73] = '\0';
      aBuf[0x74] = '\0';
      aBuf[0x75] = '\0';
      aBuf[0x76] = '\0';
      aBuf[0x77] = '\0';
      aBuf[0x78] = 'd';
      aBuf[0x79] = '\0';
      aBuf[0x7a] = '\0';
      aBuf[0x7b] = '\0';
      aBuf[0x7c] = 'd';
      aBuf[0x7d] = '\0';
      aBuf[0x7e] = '\0';
      aBuf[0x7f] = '\0';
      for (lVar19 = 0; lVar19 != 0x20; lVar19 = lVar19 + 1) {
        iVar11 = CUnpacker::GetInt(pUnpacker);
        *(int *)(aBuf + lVar19 * 4) = iVar11;
      }
      if (pUnpacker->m_Error == 0) {
        this->m_ServerMode = 0;
        pcVar15 = aBuf;
        pCVar16 = &this->m_Tuning;
        for (lVar19 = 0x10; lVar19 != 0; lVar19 = lVar19 + -1) {
          uVar2 = *(undefined8 *)pcVar15;
          pCVar16->m_GroundControlSpeed = (CTuneParam)(int)uVar2;
          pCVar16->m_GroundControlAccel = (CTuneParam)(int)((ulong)uVar2 >> 0x20);
          pcVar15 = pcVar15 + (ulong)bVar23 * -0x10 + 8;
          pCVar16 = (CTuningParams *)((long)pCVar16 + (ulong)bVar23 * -0x10 + 8);
        }
      }
      goto switchD_00175f97_caseD_5;
    }
LAB_00175f36:
    this_00 = &this->m_NetObjHandler;
    piVar12 = (int *)CNetObjHandler::SecureUnpackMsg(this_00,MsgId,pUnpacker);
    if (piVar12 == (int *)0x0) {
      pcVar15 = CNetObjHandler::GetMsgName(this_00,MsgId);
      pcVar13 = CNetObjHandler::FailedMsgOn(this_00);
      str_format(aBuf,0x100,"dropped weird message \'%s\' (%d), failed on \'%s\'",pcVar15,
                 (ulong)(uint)MsgId,pcVar13);
      (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
                (this->m_pConsole,1,"client",aBuf,0);
    }
    else {
      for (lVar19 = 0; lVar19 < (this->m_All).m_Num; lVar19 = lVar19 + 1) {
        pCVar6 = (this->m_All).m_paComponents[lVar19];
        (*pCVar6->_vptr_CComponent[0xb])(pCVar6,(ulong)(uint)MsgId,piVar12);
      }
      switch(MsgId) {
      case 4:
        if (this->m_pClient->m_State != 4) {
          iVar11 = *piVar12;
          lVar19 = (long)iVar11;
          lVar14 = (long)this->m_aClients[lVar19].m_Team;
          if (lVar14 != -1) {
            piVar1 = (this->m_GameInfo).m_aTeamSize + lVar14;
            *piVar1 = *piVar1 + -1;
            iVar11 = *piVar12;
            lVar19 = (long)iVar11;
          }
          iVar9 = piVar12[1];
          this->m_aClients[lVar19].m_Team = iVar9;
          if ((long)iVar9 != -1) {
            piVar1 = (this->m_GameInfo).m_aTeamSize + iVar9;
            *piVar1 = *piVar1 + 1;
            iVar11 = *piVar12;
            lVar19 = (long)iVar11;
          }
          CClientData::UpdateRenderInfo(this->m_aClients + lVar19,this,iVar11,false);
          if (*piVar12 == this->m_LocalClientID) {
            this->m_TeamCooldownTick = piVar12[3];
            this->m_TeamChangeTime = this->m_pClient->m_LocalTime;
          }
        }
        if (piVar12[2] == 0) {
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
            DoTeamChangeMessage(this,this->m_aClients[*piVar12].m_aName,*piVar12,piVar12[1]);
            return;
          }
          goto LAB_00176e94;
        }
        break;
      case 5:
      case 6:
      case 7:
      case 9:
      case 0xb:
      case 0xc:
      case 0xd:
      case 0xe:
      case 0xf:
      case 0x10:
      case 0x15:
        break;
      case 8:
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
          (*(this->m_pClient->super_IInterface)._vptr_IInterface[0x11])();
          return;
        }
        goto LAB_00176e94;
      case 10:
        iVar11 = *piVar12;
        this->m_aClients[iVar11].m_Emoticon = piVar12[1];
        this->m_aClients[iVar11].m_EmoticonStart = this->m_pClient->m_CurGameTick;
        break;
      case 0x11:
        pIVar5 = this->m_pClient;
        if (pIVar5->m_State != 4) {
          (*(pIVar5->super_IInterface)._vptr_IInterface[9])(pIVar5,0);
          if ((this->m_ServerSettings).m_TeamLock == false) {
            if (piVar12[3] != 0) {
              pcVar15 = "Teams were locked";
              goto LAB_00176739;
            }
          }
          else if (piVar12[3] == 0) {
            pcVar15 = "Teams were unlocked";
LAB_00176739:
            pCVar18 = this->m_pChat;
            pcVar15 = Localize(pcVar15,"");
            CChat::AddLine(pCVar18,pcVar15,-1,0,-1);
          }
          (this->m_ServerSettings).m_KickVote = *piVar12 != 0;
          (this->m_ServerSettings).m_KickMin = piVar12[1];
          (this->m_ServerSettings).m_SpecVote = piVar12[2] != 0;
          (this->m_ServerSettings).m_TeamLock = piVar12[3] != 0;
          (this->m_ServerSettings).m_TeamBalance = piVar12[4] != 0;
          (this->m_ServerSettings).m_PlayerSlots = piVar12[5];
        }
        break;
      case 0x12:
        pIVar5 = this->m_pClient;
        if (pIVar5->m_State != 4) {
          (*(pIVar5->super_IInterface)._vptr_IInterface[9])(pIVar5,0);
          if (piVar12[1] == 0) {
            iVar11 = *piVar12;
            if (this->m_aClients[iVar11].m_Active != true) {
              if ((this->m_LocalClientID != -1) && (piVar12[0x22] == 0)) {
                DoEnterMessage(this,*(char **)(piVar12 + 4),iVar11,piVar12[2]);
                iVar9 = (*(this->m_pDemoRecorder->super_IInterface)._vptr_IInterface[2])();
                iVar11 = *piVar12;
                if ((char)iVar9 != '\0') {
                  aBuf._0_8_ = *(undefined8 *)(piVar12 + 4);
                  aBuf._12_4_ = piVar12[2];
                  aBuf[8] = (char)iVar11;
                  aBuf[9] = (char)((uint)iVar11 >> 8);
                  aBuf[10] = (char)((uint)iVar11 >> 0x10);
                  aBuf[0xb] = (char)((uint)iVar11 >> 0x18);
                  IClient::SendPackMsg<CNetMsg_De_ClientEnter>
                            (this->m_pClient,(CNetMsg_De_ClientEnter *)aBuf,0x18);
                  iVar11 = *piVar12;
                }
              }
              goto LAB_00176b51;
            }
            if (this->m_pConfig->m_Debug != 0) {
              pIVar17 = this->m_pConsole;
              UNRECOVERED_JUMPTABLE = (pIVar17->super_IInterface)._vptr_IInterface[0x19];
              if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
                pcVar15 = "invalid clientinfo";
                goto LAB_00176855;
              }
              goto LAB_00176e94;
            }
          }
          else if (this->m_LocalClientID == -1) {
            iVar11 = *piVar12;
            this->m_LocalClientID = iVar11;
            this->m_TeamChangeTime = this->m_pClient->m_LocalTime;
LAB_00176b51:
            this->m_aClients[iVar11].m_Active = true;
            this->m_aClients[iVar11].m_Team = piVar12[2];
            str_utf8_copy_num(this->m_aClients[iVar11].m_aName,*(char **)(piVar12 + 4),0x41,0x10);
            str_utf8_copy_num(this->m_aClients[*piVar12].m_aClan,*(char **)(piVar12 + 6),0x31,0xc);
            this->m_aClients[*piVar12].m_Country = piVar12[8];
            pacVar21 = this->m_aClients[0].m_aaSkinPartNames;
            pacVar20 = pacVar21;
            for (lVar19 = 0; lVar19 != 0x18; lVar19 = lVar19 + 4) {
              str_utf8_copy_num((char *)((long)*piVar12 * 0x5b0 + (long)pacVar20),
                                *(char **)((long)piVar12 + lVar19 * 2 + 0x28),0x61,0x18);
              *(undefined4 *)((long)pacVar21 + lVar19 + 0x248 + (long)*piVar12 * 0x5b0) =
                   *(undefined4 *)((long)piVar12 + lVar19 + 0x58);
              *(undefined4 *)((long)pacVar21 + lVar19 + 0x260 + (long)*piVar12 * 0x5b0) =
                   *(undefined4 *)((long)piVar12 + lVar19 + 0x70);
              pacVar20 = pacVar20 + 1;
            }
            iVar9 = (*(this->m_pFriends->super_IInterface)._vptr_IInterface[6])
                              (this->m_pFriends,this->m_aClients + *piVar12,
                               this->m_aClients[*piVar12].m_aClan,1);
            iVar11 = *piVar12;
            this->m_aClients[iVar11].m_Friend = SUB41(iVar9,0);
            iVar9 = (*(this->m_pBlacklist->super_IInterface)._vptr_IInterface[3])
                              (this->m_pBlacklist,this->m_aClients + iVar11,
                               this->m_aClients[iVar11].m_aClan,1);
            iVar11 = *piVar12;
            lVar19 = (long)iVar11;
            this->m_aClients[lVar19].m_ChatIgnore = SUB41(iVar9,0);
            if (SUB41(iVar9,0) != false) {
              GetPlayerLabel(this,aLabel,0x40,iVar11,this->m_aClients[lVar19].m_aName);
              pcVar15 = Localize("%s is muted by you","");
              str_format(aBuf,0x80,pcVar15);
              CChat::AddLine(this->m_pChat,aBuf,-2,0,-1);
              iVar11 = *piVar12;
              lVar19 = (long)iVar11;
            }
            CClientData::UpdateRenderInfo(this->m_aClients + lVar19,this,iVar11,true);
            piVar1 = &(this->m_GameInfo).m_NumPlayers;
            *piVar1 = *piVar1 + 1;
            iVar11 = *piVar12;
            lVar19 = (long)this->m_aClients[iVar11].m_Team;
            if (lVar19 != -1) {
              piVar1 = (this->m_GameInfo).m_aTeamSize + lVar19;
              *piVar1 = *piVar1 + 1;
              iVar11 = *piVar12;
            }
            CStats::OnPlayerEnter(this->m_pStats,iVar11,piVar12[2]);
          }
          else if (this->m_pConfig->m_Debug != 0) {
            pIVar17 = this->m_pConsole;
            UNRECOVERED_JUMPTABLE = (pIVar17->super_IInterface)._vptr_IInterface[0x19];
            if (*(long *)(in_FS_OFFSET + 0x28) != lVar4) goto LAB_00176e94;
            pcVar15 = "invalid local clientinfo";
            goto LAB_00176855;
          }
        }
        break;
      case 0x13:
        pIVar5 = this->m_pClient;
        if (pIVar5->m_State != 4) {
          (*(pIVar5->super_IInterface)._vptr_IInterface[9])(pIVar5,0);
          iVar11 = piVar12[1];
          iVar9 = piVar12[2];
          iVar8 = piVar12[3];
          (this->m_GameInfo).m_GameFlags = piVar12[0];
          (this->m_GameInfo).m_ScoreLimit = iVar11;
          (this->m_GameInfo).m_TimeLimit = iVar9;
          (this->m_GameInfo).m_MatchNum = iVar8;
          (this->m_GameInfo).m_MatchCurrent = piVar12[4];
        }
        break;
      case 0x14:
        pIVar5 = this->m_pClient;
        if (pIVar5->m_State != 4) {
          (*(pIVar5->super_IInterface)._vptr_IInterface[9])(pIVar5,0);
          iVar11 = *piVar12;
          if (this->m_LocalClientID != iVar11) {
            lVar19 = (long)iVar11;
            if (this->m_aClients[lVar19].m_Active != false) {
              if (piVar12[4] == 0) {
                DoLeaveMessage(this,this->m_aClients[lVar19].m_aName,iVar11,*(char **)(piVar12 + 2))
                ;
                iVar11 = *piVar12;
                aBuf._0_8_ = this->m_aClients + iVar11;
                aBuf[8] = (char)iVar11;
                aBuf[9] = (char)((uint)iVar11 >> 8);
                aBuf[10] = (char)((uint)iVar11 >> 0x10);
                aBuf[0xb] = (char)((uint)iVar11 >> 0x18);
                aBuf._16_8_ = *(undefined8 *)(piVar12 + 2);
                IClient::SendPackMsg<CNetMsg_De_ClientLeave>
                          (this->m_pClient,(CNetMsg_De_ClientLeave *)aBuf,0x18);
                iVar11 = *piVar12;
                lVar19 = (long)iVar11;
              }
              piVar1 = &(this->m_GameInfo).m_NumPlayers;
              *piVar1 = *piVar1 + -1;
              lVar19 = (long)this->m_aClients[lVar19].m_Team;
              if (lVar19 != -1) {
                piVar1 = (this->m_GameInfo).m_aTeamSize + lVar19;
                *piVar1 = *piVar1 + -1;
                iVar11 = *piVar12;
              }
              CClientData::Reset(this->m_aClients + iVar11,this,iVar11);
              CStats::OnPlayerLeave(this->m_pStats,*piVar12);
              break;
            }
          }
          if (this->m_pConfig->m_Debug != 0) {
            pIVar17 = this->m_pConsole;
            UNRECOVERED_JUMPTABLE = (pIVar17->super_IInterface)._vptr_IInterface[0x19];
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
              pcVar15 = "invalid clientdrop";
LAB_00176855:
              (*UNRECOVERED_JUMPTABLE)(pIVar17,1,"client",pcVar15,0);
              return;
            }
            goto LAB_00176e94;
          }
        }
        break;
      case 0x16:
        if (this->m_pClient->m_State == 4) {
          DoEnterMessage(this,*(char **)piVar12,piVar12[2],piVar12[3]);
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
            CStats::OnPlayerEnter(this->m_pStats,piVar12[2],piVar12[3]);
            return;
          }
          goto LAB_00176e94;
        }
        break;
      case 0x17:
        if (this->m_pClient->m_State == 4) {
          DoLeaveMessage(this,*(char **)piVar12,piVar12[2],*(char **)(piVar12 + 4));
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
            CStats::OnPlayerLeave(this->m_pStats,piVar12[2]);
            return;
          }
          goto LAB_00176e94;
        }
        break;
      default:
        if ((MsgId == 0x21) && (pIVar5 = this->m_pClient, pIVar5->m_State != 4)) {
          (*(pIVar5->super_IInterface)._vptr_IInterface[9])(pIVar5,0);
          if (this->m_aClients[*piVar12].m_Active == true) {
            pacVar20 = this->m_aClients[0].m_aaSkinPartNames;
            lVar19 = 0;
            pacVar21 = pacVar20;
            while( true ) {
              iVar11 = *piVar12;
              if (lVar19 == 0x18) break;
              str_utf8_copy_num((char *)((long)iVar11 * 0x5b0 + (long)pacVar21),
                                *(char **)((long)piVar12 + lVar19 * 2 + 8),0x61,0x18);
              *(undefined4 *)((long)pacVar20 + lVar19 + 0x248 + (long)*piVar12 * 0x5b0) =
                   *(undefined4 *)((long)piVar12 + lVar19 + 0x38);
              *(undefined4 *)((long)pacVar20 + lVar19 + 0x260 + (long)*piVar12 * 0x5b0) =
                   *(undefined4 *)((long)piVar12 + lVar19 + 0x50);
              lVar19 = lVar19 + 4;
              pacVar21 = pacVar21 + 1;
            }
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
              CClientData::UpdateRenderInfo(this->m_aClients + iVar11,this,iVar11,true);
              return;
            }
            goto LAB_00176e94;
          }
          if (this->m_pConfig->m_Debug != 0) {
            pIVar17 = this->m_pConsole;
            UNRECOVERED_JUMPTABLE = (pIVar17->super_IInterface)._vptr_IInterface[0x19];
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
              pcVar15 = "invalid skin info";
              goto LAB_00176855;
            }
            goto LAB_00176e94;
          }
        }
      }
    }
    goto switchD_00175f97_caseD_5;
  }
  uVar10 = CUnpacker::GetInt(pUnpacker);
  if (10 < uVar10) goto switchD_00175f97_caseD_5;
  iVar11 = gs_GameMsgList[uVar10].m_ParaType;
  if (iVar11 == 3) {
    lStack_1a0 = 3;
LAB_001762fe:
    bVar7 = false;
  }
  else {
    if (iVar11 == 2) {
      lStack_1a0 = 2;
      goto LAB_001762fe;
    }
    if (iVar11 == 1) {
      lStack_1a0 = 1;
      goto LAB_001762fe;
    }
    bVar7 = true;
    lStack_1a0 = 0;
  }
  for (lVar19 = 0; lStack_1a0 != lVar19; lVar19 = lVar19 + 1) {
    iVar11 = CUnpacker::GetInt(pUnpacker);
    aParaI[lVar19] = iVar11;
  }
  if (pUnpacker->m_Error != 0) goto switchD_00175f97_caseD_5;
  iVar11 = gs_GameMsgList[uVar10].m_Action;
  if (iVar11 != 2) {
    if (bVar7) {
      pcVar15 = Localize(gs_GameMsgList[uVar10].m_pText,"");
    }
    else {
      pcVar15 = "";
    }
    if (iVar11 == 1) {
      CBroadcast::DoClientBroadcast(this->m_pBroadcast,pcVar15);
    }
    else if (iVar11 == 0) {
      CChat::AddLine(this->m_pChat,pcVar15,-1,0,-1);
    }
    goto LAB_00175f36;
  }
  if (6 < uVar10 - 4) goto switchD_00175f97_caseD_5;
  uVar3 = (this->m_GameInfo).m_GameFlags;
  switch(uVar10) {
  case 4:
    this_01 = this->m_pSounds;
    iVar11 = 0x23;
    break;
  case 5:
    this_01 = this->m_pSounds;
    iVar11 = 0x24;
    break;
  case 6:
    if ((uVar3 & 1) == 0) {
      pcVar13 = "All players were moved to the spectators";
      if (aParaI[0] == 0) {
        pcVar13 = "All players were moved to the game";
      }
    }
    else {
      pcVar15 = "All players were moved to the spectators";
      if (aParaI[0] == 1) {
        pcVar15 = "All players were moved to the blue team";
      }
      pcVar13 = "All players were moved to the red team";
      if (aParaI[0] != 0) {
        pcVar13 = pcVar15;
      }
    }
    pcVar15 = Localize(pcVar13,"");
    this_02 = this->m_pBroadcast;
    goto LAB_00176e6a;
  case 7:
    pcVar15 = "";
    if ((uVar3 & 1) != 0) {
      if (aParaI[0] == 0) {
        pcVar15 = "You were moved to the red team due to team balancing";
      }
      else {
        if (aParaI[0] != 1) goto LAB_00176e63;
        pcVar15 = "You were moved to the blue team due to team balancing";
      }
      pcVar15 = Localize(pcVar15,"");
    }
LAB_00176e63:
    this_02 = this->m_pBroadcast;
LAB_00176e6a:
    CBroadcast::DoClientBroadcast(this_02,pcVar15);
    goto switchD_00175f97_caseD_5;
  case 8:
    if (((long)this->m_LocalClientID == -1) ||
       ((iVar11 = this->m_aClients[this->m_LocalClientID].m_Team, iVar11 == aParaI[0] &&
        (((this->m_Snap).m_SpecInfo.m_Active != true ||
         ((((lVar19 = (long)(this->m_Snap).m_SpecInfo.m_SpectatorID, lVar19 == -1 ||
            (this->m_aClients[lVar19].m_Team == iVar11)) &&
           (iVar9 = (this->m_Snap).m_SpecInfo.m_SpecMode, iVar11 == 0 || iVar9 != 2)) &&
          (iVar11 == 1 || iVar9 != 3)))))))) {
      this_01 = this->m_pSounds;
      iVar11 = 0x26;
    }
    else {
      this_01 = this->m_pSounds;
      iVar11 = 0x25;
    }
    break;
  case 9:
    CSounds::Enqueue(this->m_pSounds,3,0x27);
    uVar10 = 0x3f;
    if (aParaI[1] < 0x3f) {
      uVar10 = aParaI[1];
    }
    uVar22 = 0;
    if (0 < (int)uVar10) {
      uVar22 = (ulong)uVar10;
    }
    CStats::OnFlagCapture(this->m_pStats,(int)uVar22);
    GetPlayerLabel(this,aLabel,0x40,(int)uVar22,this->m_aClients[uVar22].m_aName);
    fVar24 = (float)aParaI[2] / (float)this->m_pClient->m_GameTickSpeed;
    if (fVar24 <= 60.0) {
      if (aParaI[0] == 0) {
        pcVar15 = "The red flag was captured by \'%s\' (%.2f seconds)";
      }
      else {
        pcVar15 = "The blue flag was captured by \'%s\' (%.2f seconds)";
      }
      pcVar15 = Localize(pcVar15,"");
      str_format(aBuf,0x100,pcVar15,SUB84((double)fVar24,0));
    }
    else {
      if (aParaI[0] == 0) {
        pcVar15 = "The red flag was captured by \'%s\'";
      }
      else {
        pcVar15 = "The blue flag was captured by \'%s\'";
      }
      pcVar15 = Localize(pcVar15,"");
      str_format(aBuf,0x100,pcVar15);
    }
    pCVar18 = this->m_pChat;
    goto LAB_00176e41;
  case 10:
    uVar10 = 0x3f;
    if (aParaI[0] < 0x3f) {
      uVar10 = aParaI[0];
    }
    if ((int)uVar10 < 1) {
      uVar10 = 0;
    }
    GetPlayerLabel(this,aLabel,0x40,uVar10,this->m_aClients[uVar10].m_aName);
    pcVar15 = Localize("\'%s\' initiated a pause","");
    str_format(aBuf,0x100,pcVar15);
    pCVar18 = this->m_pChat;
LAB_00176e41:
    CChat::AddLine(pCVar18,aBuf,-1,0,-1);
    goto switchD_00175f97_caseD_5;
  }
  CSounds::Enqueue(this_01,3,iVar11);
switchD_00175f97_caseD_5:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
    return;
  }
LAB_00176e94:
  __stack_chk_fail();
}

Assistant:

void CGameClient::OnMessage(int MsgId, CUnpacker *pUnpacker)
{
	Client()->RecordGameMessage(true);

	// special messages
	if(MsgId == NETMSGTYPE_SV_TUNEPARAMS && Client()->State() != IClient::STATE_DEMOPLAYBACK)
	{
		Client()->RecordGameMessage(false);
		// unpack the new tuning
		CTuningParams NewTuning;
		int *pParams = (int *)&NewTuning;
		for(unsigned i = 0; i < sizeof(CTuningParams)/sizeof(int); i++)
			pParams[i] = pUnpacker->GetInt();

		// check for unpacking errors
		if(pUnpacker->Error())
			return;

		m_ServerMode = SERVERMODE_PURE;

		// apply new tuning
		m_Tuning = NewTuning;
		return;
	}
	else if(MsgId == NETMSGTYPE_SV_VOTEOPTIONLISTADD)
	{
		int NumOptions = pUnpacker->GetInt();
		for(int i = 0; i < NumOptions; i++)
		{
			const char *pDescription = pUnpacker->GetString(CUnpacker::SANITIZE_CC);
			if(pUnpacker->Error())
				return;

			m_pVoting->AddOption(pDescription);
		}
	}
	else if(MsgId == NETMSGTYPE_SV_GAMEMSG)
	{
		int GameMsgID = pUnpacker->GetInt();

		// check for valid gamemsgid
		if(GameMsgID < 0 || GameMsgID >= NUM_GAMEMSGS)
			return;

		int aParaI[3];
		int NumParaI = 0;

		// get paras
		switch(gs_GameMsgList[GameMsgID].m_ParaType)
		{
		case PARA_I: NumParaI = 1; break;
		case PARA_II: NumParaI = 2; break;
		case PARA_III: NumParaI = 3; break;
		}
		for(int i = 0; i < NumParaI; i++)
		{
			aParaI[i] = pUnpacker->GetInt();
		}

		// check for unpacking errors
		if(pUnpacker->Error())
			return;

		// handle special messages
		char aBuf[256];
		bool TeamPlay = m_GameInfo.m_GameFlags&GAMEFLAG_TEAMS;
		if(gs_GameMsgList[GameMsgID].m_Action == DO_SPECIAL)
		{
			switch(GameMsgID)
			{
			case GAMEMSG_CTF_DROP:
				m_pSounds->Enqueue(CSounds::CHN_GLOBAL, SOUND_CTF_DROP);
				break;
			case GAMEMSG_CTF_RETURN:
				m_pSounds->Enqueue(CSounds::CHN_GLOBAL, SOUND_CTF_RETURN);
				break;
			case GAMEMSG_TEAM_ALL:
				{
					const char *pMsg = "";
					switch(GetStrTeam(aParaI[0], TeamPlay))
					{
					case STR_TEAM_GAME: pMsg = Localize("All players were moved to the game"); break;
					case STR_TEAM_RED: pMsg = Localize("All players were moved to the red team"); break;
					case STR_TEAM_BLUE: pMsg = Localize("All players were moved to the blue team"); break;
					case STR_TEAM_SPECTATORS: pMsg = Localize("All players were moved to the spectators"); break;
					}
					m_pBroadcast->DoClientBroadcast(pMsg);
				}
				break;
			case GAMEMSG_TEAM_BALANCE_VICTIM:
				{
					const char *pMsg = "";
					switch(GetStrTeam(aParaI[0], TeamPlay))
					{
					case STR_TEAM_RED: pMsg = Localize("You were moved to the red team due to team balancing"); break;
					case STR_TEAM_BLUE: pMsg = Localize("You were moved to the blue team due to team balancing"); break;
					}
					m_pBroadcast->DoClientBroadcast(pMsg);
				}
				break;
			case GAMEMSG_CTF_GRAB:
				if(m_LocalClientID != -1 && (m_aClients[m_LocalClientID].m_Team != aParaI[0] || (m_Snap.m_SpecInfo.m_Active &&
								((m_Snap.m_SpecInfo.m_SpectatorID != -1 && m_aClients[m_Snap.m_SpecInfo.m_SpectatorID].m_Team != aParaI[0]) ||
								(m_Snap.m_SpecInfo.m_SpecMode == SPEC_FLAGRED && aParaI[0] != TEAM_RED) ||
								(m_Snap.m_SpecInfo.m_SpecMode == SPEC_FLAGBLUE && aParaI[0] != TEAM_BLUE)))))
					m_pSounds->Enqueue(CSounds::CHN_GLOBAL, SOUND_CTF_GRAB_PL);
				else
					m_pSounds->Enqueue(CSounds::CHN_GLOBAL, SOUND_CTF_GRAB_EN);
				break;
			case GAMEMSG_GAME_PAUSED:
				{
					int ClientID = clamp(aParaI[0], 0, MAX_CLIENTS - 1);
					char aLabel[64];
					GetPlayerLabel(aLabel, sizeof(aLabel), ClientID, m_aClients[ClientID].m_aName);
					str_format(aBuf, sizeof(aBuf), Localize("'%s' initiated a pause"), aLabel);
					m_pChat->AddLine(aBuf);
				}
				break;
			case GAMEMSG_CTF_CAPTURE:
				m_pSounds->Enqueue(CSounds::CHN_GLOBAL, SOUND_CTF_CAPTURE);
				int ClientID = clamp(aParaI[1], 0, MAX_CLIENTS - 1);
				m_pStats->OnFlagCapture(ClientID);
				char aLabel[64];
				GetPlayerLabel(aLabel, sizeof(aLabel), ClientID, m_aClients[ClientID].m_aName);

				float Time = aParaI[2] / (float)Client()->GameTickSpeed();
				if(Time <= 60)
				{
					if(aParaI[0])
					{
						str_format(aBuf, sizeof(aBuf), Localize("The blue flag was captured by '%s' (%.2f seconds)"), aLabel, Time);
					}
					else
					{
						str_format(aBuf, sizeof(aBuf), Localize("The red flag was captured by '%s' (%.2f seconds)"), aLabel, Time);
					}
				}
				else
				{
					if(aParaI[0])
					{
						str_format(aBuf, sizeof(aBuf), Localize("The blue flag was captured by '%s'"), aLabel);
					}
					else
					{
						str_format(aBuf, sizeof(aBuf), Localize("The red flag was captured by '%s'"), aLabel);
					}
				}
				m_pChat->AddLine(aBuf);
			}
			return;
		}

		// build message
		const char *pText = "";
		if(NumParaI == 0)
		{
			pText = Localize(gs_GameMsgList[GameMsgID].m_pText);
		}

		// handle message
		switch(gs_GameMsgList[GameMsgID].m_Action)
		{
		case DO_CHAT:
			m_pChat->AddLine(pText);
			break;
		case DO_BROADCAST:
			m_pBroadcast->DoClientBroadcast(pText);
			break;
		}
	}

	void *pRawMsg = m_NetObjHandler.SecureUnpackMsg(MsgId, pUnpacker);
	if(!pRawMsg)
	{
		char aBuf[256];
		str_format(aBuf, sizeof(aBuf), "dropped weird message '%s' (%d), failed on '%s'", m_NetObjHandler.GetMsgName(MsgId), MsgId, m_NetObjHandler.FailedMsgOn());
		Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "client", aBuf);
		return;
	}

	// TODO: this should be done smarter
	for(int i = 0; i < m_All.m_Num; i++)
		m_All.m_paComponents[i]->OnMessage(MsgId, pRawMsg);

	if(MsgId == NETMSGTYPE_SV_CLIENTINFO && Client()->State() != IClient::STATE_DEMOPLAYBACK)
	{
		Client()->RecordGameMessage(false);
		CNetMsg_Sv_ClientInfo *pMsg = (CNetMsg_Sv_ClientInfo *)pRawMsg;

		if(pMsg->m_Local)
		{
			if(m_LocalClientID != -1)
			{
				if(Config()->m_Debug)
					Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "client", "invalid local clientinfo");
				return;
			}
			m_LocalClientID = pMsg->m_ClientID;
			m_TeamChangeTime = Client()->LocalTime();
		}
		else
		{
			if(m_aClients[pMsg->m_ClientID].m_Active)
			{
				if(Config()->m_Debug)
					Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "client", "invalid clientinfo");
				return;
			}

			if(m_LocalClientID != -1 && !pMsg->m_Silent)
			{
				DoEnterMessage(pMsg->m_pName, pMsg->m_ClientID, pMsg->m_Team);

				if(m_pDemoRecorder->IsRecording())
				{
					CNetMsg_De_ClientEnter Msg;
					Msg.m_pName = pMsg->m_pName;
					Msg.m_ClientID = pMsg->m_ClientID;
					Msg.m_Team = pMsg->m_Team;
					Client()->SendPackMsg(&Msg, MSGFLAG_NOSEND|MSGFLAG_RECORD);
				}
			}
		}

		m_aClients[pMsg->m_ClientID].m_Active = true;
		m_aClients[pMsg->m_ClientID].m_Team  = pMsg->m_Team;
		str_utf8_copy_num(m_aClients[pMsg->m_ClientID].m_aName, pMsg->m_pName, sizeof(m_aClients[pMsg->m_ClientID].m_aName), MAX_NAME_LENGTH);
		str_utf8_copy_num(m_aClients[pMsg->m_ClientID].m_aClan, pMsg->m_pClan, sizeof(m_aClients[pMsg->m_ClientID].m_aClan), MAX_CLAN_LENGTH);
		m_aClients[pMsg->m_ClientID].m_Country = pMsg->m_Country;
		for(int i = 0; i < NUM_SKINPARTS; i++)
		{
			str_utf8_copy_num(m_aClients[pMsg->m_ClientID].m_aaSkinPartNames[i], pMsg->m_apSkinPartNames[i], sizeof(m_aClients[pMsg->m_ClientID].m_aaSkinPartNames[i]), MAX_SKIN_LENGTH);
			m_aClients[pMsg->m_ClientID].m_aUseCustomColors[i] = pMsg->m_aUseCustomColors[i];
			m_aClients[pMsg->m_ClientID].m_aSkinPartColors[i] = pMsg->m_aSkinPartColors[i];
		}

		// update friend state
		m_aClients[pMsg->m_ClientID].m_Friend = Friends()->IsFriend(m_aClients[pMsg->m_ClientID].m_aName, m_aClients[pMsg->m_ClientID].m_aClan, true);
		// update chat ignore state
		m_aClients[pMsg->m_ClientID].m_ChatIgnore = Blacklist()->IsIgnored(m_aClients[pMsg->m_ClientID].m_aName, m_aClients[pMsg->m_ClientID].m_aClan, true);
		if(m_aClients[pMsg->m_ClientID].m_ChatIgnore)
		{
			char aBuf[128];
			char aLabel[64];
			GetPlayerLabel(aLabel, sizeof(aLabel), pMsg->m_ClientID, m_aClients[pMsg->m_ClientID].m_aName);
			str_format(aBuf, sizeof(aBuf), Localize("%s is muted by you"), aLabel);
			m_pChat->AddLine(aBuf, CChat::CLIENT_MSG);
		}

		m_aClients[pMsg->m_ClientID].UpdateRenderInfo(this, pMsg->m_ClientID, true);

		m_GameInfo.m_NumPlayers++;
		// calculate team-balance
		if(m_aClients[pMsg->m_ClientID].m_Team != TEAM_SPECTATORS)
			m_GameInfo.m_aTeamSize[m_aClients[pMsg->m_ClientID].m_Team]++;

		m_pStats->OnPlayerEnter(pMsg->m_ClientID, pMsg->m_Team);
	}
	else if(MsgId == NETMSGTYPE_SV_CLIENTDROP && Client()->State() != IClient::STATE_DEMOPLAYBACK)
	{
		Client()->RecordGameMessage(false);
		CNetMsg_Sv_ClientDrop *pMsg = (CNetMsg_Sv_ClientDrop *)pRawMsg;

		if(m_LocalClientID == pMsg->m_ClientID || !m_aClients[pMsg->m_ClientID].m_Active)
		{
			if(Config()->m_Debug)
				Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "client", "invalid clientdrop");
			return;
		}

		if(!pMsg->m_Silent)
		{
			DoLeaveMessage(m_aClients[pMsg->m_ClientID].m_aName, pMsg->m_ClientID, pMsg->m_pReason);

			CNetMsg_De_ClientLeave Msg;
			Msg.m_pName = m_aClients[pMsg->m_ClientID].m_aName;
			Msg.m_ClientID = pMsg->m_ClientID;
			Msg.m_pReason = pMsg->m_pReason;
			Client()->SendPackMsg(&Msg, MSGFLAG_NOSEND | MSGFLAG_RECORD);
		}

		m_GameInfo.m_NumPlayers--;
		// calculate team-balance
		if(m_aClients[pMsg->m_ClientID].m_Team != TEAM_SPECTATORS)
			m_GameInfo.m_aTeamSize[m_aClients[pMsg->m_ClientID].m_Team]--;

		m_aClients[pMsg->m_ClientID].Reset(this, pMsg->m_ClientID);
		m_pStats->OnPlayerLeave(pMsg->m_ClientID);
	}
	else if(MsgId == NETMSGTYPE_SV_SKINCHANGE && Client()->State() != IClient::STATE_DEMOPLAYBACK)
	{
		Client()->RecordGameMessage(false);
		CNetMsg_Sv_SkinChange *pMsg = (CNetMsg_Sv_SkinChange *)pRawMsg;

		if(!m_aClients[pMsg->m_ClientID].m_Active)
		{
			if(Config()->m_Debug)
				Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "client", "invalid skin info");
			return;
		}

		for(int i = 0; i < NUM_SKINPARTS; i++)
		{
			str_utf8_copy_num(m_aClients[pMsg->m_ClientID].m_aaSkinPartNames[i], pMsg->m_apSkinPartNames[i], sizeof(m_aClients[pMsg->m_ClientID].m_aaSkinPartNames[i]), MAX_SKIN_LENGTH);
			m_aClients[pMsg->m_ClientID].m_aUseCustomColors[i] = pMsg->m_aUseCustomColors[i];
			m_aClients[pMsg->m_ClientID].m_aSkinPartColors[i] = pMsg->m_aSkinPartColors[i];
		}
		m_aClients[pMsg->m_ClientID].UpdateRenderInfo(this, pMsg->m_ClientID, true);
	}
	else if(MsgId == NETMSGTYPE_SV_GAMEINFO && Client()->State() != IClient::STATE_DEMOPLAYBACK)
	{
		Client()->RecordGameMessage(false);
		CNetMsg_Sv_GameInfo *pMsg = (CNetMsg_Sv_GameInfo *)pRawMsg;

		m_GameInfo.m_GameFlags = pMsg->m_GameFlags;
		m_GameInfo.m_ScoreLimit = pMsg->m_ScoreLimit;
		m_GameInfo.m_TimeLimit = pMsg->m_TimeLimit;
		m_GameInfo.m_MatchNum = pMsg->m_MatchNum;
		m_GameInfo.m_MatchCurrent = pMsg->m_MatchCurrent;
	}
	else if(MsgId == NETMSGTYPE_SV_SERVERSETTINGS && Client()->State() != IClient::STATE_DEMOPLAYBACK)
	{
		Client()->RecordGameMessage(false);
		CNetMsg_Sv_ServerSettings *pMsg = (CNetMsg_Sv_ServerSettings *)pRawMsg;

		if(!m_ServerSettings.m_TeamLock && pMsg->m_TeamLock)
			m_pChat->AddLine(Localize("Teams were locked"));
		else if(m_ServerSettings.m_TeamLock && !pMsg->m_TeamLock)
			m_pChat->AddLine(Localize("Teams were unlocked"));

		m_ServerSettings.m_KickVote = pMsg->m_KickVote;
		m_ServerSettings.m_KickMin = pMsg->m_KickMin;
		m_ServerSettings.m_SpecVote = pMsg->m_SpecVote;
		m_ServerSettings.m_TeamLock = pMsg->m_TeamLock;
		m_ServerSettings.m_TeamBalance = pMsg->m_TeamBalance;
		m_ServerSettings.m_PlayerSlots = pMsg->m_PlayerSlots;
	}
	else if(MsgId == NETMSGTYPE_SV_TEAM)
	{
		CNetMsg_Sv_Team *pMsg = (CNetMsg_Sv_Team *)pRawMsg;

		if(Client()->State() != IClient::STATE_DEMOPLAYBACK)
		{
			// calculate team-balance
			if(m_aClients[pMsg->m_ClientID].m_Team != TEAM_SPECTATORS)
				m_GameInfo.m_aTeamSize[m_aClients[pMsg->m_ClientID].m_Team]--;
			m_aClients[pMsg->m_ClientID].m_Team = pMsg->m_Team;
			if(m_aClients[pMsg->m_ClientID].m_Team != TEAM_SPECTATORS)
				m_GameInfo.m_aTeamSize[m_aClients[pMsg->m_ClientID].m_Team]++;

			m_aClients[pMsg->m_ClientID].UpdateRenderInfo(this, pMsg->m_ClientID, false);

			if(pMsg->m_ClientID == m_LocalClientID)
			{
				m_TeamCooldownTick = pMsg->m_CooldownTick;
				m_TeamChangeTime = Client()->LocalTime();
			}
		}

		if(pMsg->m_Silent == 0)
		{
			DoTeamChangeMessage(m_aClients[pMsg->m_ClientID].m_aName, pMsg->m_ClientID, pMsg->m_Team);
		}
	}
	else if(MsgId == NETMSGTYPE_SV_READYTOENTER)
	{
		Client()->EnterGame();
	}
	else if (MsgId == NETMSGTYPE_SV_EMOTICON)
	{
		CNetMsg_Sv_Emoticon *pMsg = (CNetMsg_Sv_Emoticon *)pRawMsg;

		// apply
		m_aClients[pMsg->m_ClientID].m_Emoticon = pMsg->m_Emoticon;
		m_aClients[pMsg->m_ClientID].m_EmoticonStart = Client()->GameTick();
	}
	else if(MsgId == NETMSGTYPE_DE_CLIENTENTER && Client()->State() == IClient::STATE_DEMOPLAYBACK)
	{
		CNetMsg_De_ClientEnter *pMsg = (CNetMsg_De_ClientEnter *)pRawMsg;
		DoEnterMessage(pMsg->m_pName, pMsg->m_ClientID, pMsg->m_Team);
		m_pStats->OnPlayerEnter(pMsg->m_ClientID, pMsg->m_Team);
	}
	else if(MsgId == NETMSGTYPE_DE_CLIENTLEAVE && Client()->State() == IClient::STATE_DEMOPLAYBACK)
	{
		CNetMsg_De_ClientLeave *pMsg = (CNetMsg_De_ClientLeave *)pRawMsg;
		DoLeaveMessage(pMsg->m_pName, pMsg->m_ClientID, pMsg->m_pReason);
		m_pStats->OnPlayerLeave(pMsg->m_ClientID);
	}
}